

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::IsConcurrentSweepState(Recycler *this)

{
  return (BOOL)((this->collectionState).value == CollectionStateConcurrentSweep);
}

Assistant:

BOOL
Recycler::IsConcurrentSweepState() const
{
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        return this->collectionState == CollectionStateConcurrentSweepPass1 ||
            this->collectionState == CollectionStateConcurrentSweepPass1Wait ||
            this->collectionState == CollectionStateConcurrentSweepPass2 ||
            this->collectionState == CollectionStateConcurrentSweepPass2Wait;
    }
    else
#endif
    {
        return this->collectionState == CollectionStateConcurrentSweep;
    }
}